

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  pointer ppTVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  pointer ppTVar5;
  pointer ppTVar6;
  TimeInMillis ms;
  TimeInMillis ms_00;
  UnitTestImpl *pUVar7;
  uint uVar8;
  long lVar9;
  undefined1 local_b0 [8];
  string kTestsuites;
  long local_80;
  undefined1 local_70 [8];
  string kIndent;
  long local_48;
  long local_40;
  
  local_b0 = (undefined1  [8])&kTestsuites._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"testsuites","");
  local_70 = (undefined1  [8])&kIndent._M_string_length;
  std::__cxx11::string::_M_construct((ulong)local_70,'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  kIndent.field_2._8_8_ = &stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&kIndent.field_2 + 8),"tests","")
  ;
  iVar3 = UnitTestImpl::reportable_test_count(unit_test->impl_);
  OutputJsonKey(stream,(string *)local_b0,(string *)((long)&kIndent.field_2 + 8),iVar3,
                (string *)local_70,true);
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffffc0) {
    operator_delete((void *)kIndent.field_2._8_8_,local_40 + 1);
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kIndent.field_2 + 8),"failures","");
  iVar3 = UnitTestImpl::failed_test_count(unit_test->impl_);
  OutputJsonKey(stream,(string *)local_b0,(string *)((long)&kIndent.field_2 + 8),iVar3,
                (string *)local_70,true);
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffffc0) {
    operator_delete((void *)kIndent.field_2._8_8_,local_40 + 1);
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kIndent.field_2 + 8),"disabled","");
  iVar3 = UnitTestImpl::reportable_disabled_test_count(unit_test->impl_);
  OutputJsonKey(stream,(string *)local_b0,(string *)((long)&kIndent.field_2 + 8),iVar3,
                (string *)local_70,true);
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffffc0) {
    operator_delete((void *)kIndent.field_2._8_8_,local_40 + 1);
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kIndent.field_2 + 8),"errors","");
  OutputJsonKey(stream,(string *)local_b0,(string *)((long)&kIndent.field_2 + 8),0,
                (string *)local_70,true);
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffffc0) {
    operator_delete((void *)kIndent.field_2._8_8_,local_40 + 1);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    kIndent.field_2._8_8_ = &stack0xffffffffffffffc0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&kIndent.field_2 + 8),"random_seed","");
    OutputJsonKey(stream,(string *)local_b0,(string *)((long)&kIndent.field_2 + 8),
                  unit_test->impl_->random_seed_,(string *)local_70,true);
    if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffffc0) {
      operator_delete((void *)kIndent.field_2._8_8_,local_40 + 1);
    }
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kIndent.field_2 + 8),"timestamp","");
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
            ((string *)((long)&kTestsuites.field_2 + 8),
             (internal *)unit_test->impl_->start_timestamp_,ms);
  OutputJsonKey(stream,(string *)local_b0,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuites.field_2 + 8),(string *)local_70,true);
  if ((long *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffff80) {
    operator_delete((void *)kTestsuites.field_2._8_8_,local_80 + 1);
  }
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffffc0) {
    operator_delete((void *)kIndent.field_2._8_8_,local_40 + 1);
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&kIndent.field_2 + 8),"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_
            ((string *)((long)&kTestsuites.field_2 + 8),(internal *)unit_test->impl_->elapsed_time_,
             ms_00);
  OutputJsonKey(stream,(string *)local_b0,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuites.field_2 + 8),(string *)local_70,false);
  if ((long *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffff80) {
    operator_delete((void *)kTestsuites.field_2._8_8_,local_80 + 1);
  }
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffffc0) {
    operator_delete((void *)kIndent.field_2._8_8_,local_40 + 1);
  }
  TestPropertiesAsJson
            ((string *)((long)&kIndent.field_2 + 8),&unit_test->impl_->ad_hoc_test_result_,
             (string *)local_70);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)kIndent.field_2._8_8_,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",\n",2);
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffffc0) {
    operator_delete((void *)kIndent.field_2._8_8_,local_40 + 1);
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&kIndent.field_2 + 8),"name","");
  kTestsuites.field_2._8_8_ = &stack0xffffffffffffff80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kTestsuites.field_2 + 8),"AllTests","");
  OutputJsonKey(stream,(string *)local_b0,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuites.field_2 + 8),(string *)local_70,true);
  if ((long *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffff80) {
    operator_delete((void *)kTestsuites.field_2._8_8_,local_80 + 1);
  }
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffffc0) {
    operator_delete((void *)kIndent.field_2._8_8_,local_40 + 1);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_70,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_b0,(long)kTestsuites._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": [\n",5);
  pUVar7 = unit_test->impl_;
  ppTVar5 = (pUVar7->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar7->test_suites_).
                              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >> 3)) {
    lVar9 = 0;
    bVar2 = false;
    do {
      ppTVar6 = (ppTVar5[lVar9]->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar1 = *(pointer *)
                 ((long)&(ppTVar5[lVar9]->test_info_list_).
                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                         ._M_impl + 8);
      if (ppTVar6 != ppTVar1) {
        iVar3 = 0;
        do {
          uVar8 = (*ppTVar6)->is_in_another_shard_ ^ 1;
          if ((*ppTVar6)->matches_filter_ == false) {
            uVar8 = 0;
          }
          iVar3 = iVar3 + uVar8;
          ppTVar6 = ppTVar6 + 1;
        } while (ppTVar6 != ppTVar1);
        if (iVar3 != 0) {
          if (bVar2) {
            std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
            pUVar7 = unit_test->impl_;
          }
          PrintJsonTestSuite(stream,(pUVar7->test_suites_).
                                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar9]);
          pUVar7 = unit_test->impl_;
          bVar2 = true;
        }
      }
      lVar9 = lVar9 + 1;
      ppTVar5 = (pUVar7->test_suites_).
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar9 < (int)((ulong)((long)(pUVar7->test_suites_).
                                         super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5)
                          >> 3));
  }
  bVar2 = TestResult::Failed(&pUVar7->ad_hoc_test_result_);
  if (bVar2) {
    OutputJsonTestSuiteForTestResult(stream,&unit_test->impl_->ad_hoc_test_result_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_70,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
  if (local_70 != (undefined1  [8])&kIndent._M_string_length) {
    operator_delete((void *)local_70,kIndent._M_string_length + 1);
  }
  if (local_b0 != (undefined1  [8])&kTestsuites._M_string_length) {
    operator_delete((void *)local_b0,kTestsuites._M_string_length + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG_GET(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestSuite(stream, *unit_test.GetTestSuite(i));
    }
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    OutputJsonTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}